

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stdio.c
# Opt level: O0

size_t file_stdio_fread(ALLEGRO_FILE *f,void *ptr,size_t size)

{
  int errnum;
  USERDATA *pUVar1;
  int *piVar2;
  ulong in_RDX;
  undefined1 *in_RSI;
  size_t ret;
  int c;
  USERDATA *userdata;
  ALLEGRO_FILE *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  size_t local_8;
  
  pUVar1 = get_userdata(in_stack_ffffffffffffffc8);
  if (in_RDX == 1) {
    errnum = fgetc((FILE *)pUVar1->fp);
    if (errnum == -1) {
      piVar2 = __errno_location();
      pUVar1->errnum = *piVar2;
      __errno_location();
      al_set_errno(errnum);
      local_8 = 0;
    }
    else {
      *in_RSI = (char)errnum;
      local_8 = 1;
    }
  }
  else {
    local_8 = fread(in_RSI,1,in_RDX,(FILE *)pUVar1->fp);
    if (local_8 < in_RDX) {
      piVar2 = __errno_location();
      pUVar1->errnum = *piVar2;
      __errno_location();
      al_set_errno(in_stack_ffffffffffffffd4);
    }
  }
  return local_8;
}

Assistant:

static size_t file_stdio_fread(ALLEGRO_FILE *f, void *ptr, size_t size)
{
   USERDATA *userdata = get_userdata(f);

   if (size == 1) {
      /* Optimise common case. */
      int c = fgetc(userdata->fp);
      if (c == EOF) {
         userdata->errnum = errno;
         al_set_errno(errno);
         return 0;
      }
      *((char *)ptr) = (char)c;
      return 1;
   }
   else {
      size_t ret = fread(ptr, 1, size, userdata->fp);
      if (ret < size) {
         userdata->errnum = errno;
         al_set_errno(errno);
      }
      return ret;
   }
}